

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O3

pointer __thiscall
phmap::priv::
parallel_hash_set<4ul,phmap::priv::raw_hash_set,std::mutex,phmap::priv::FlatHashMapPolicy<int,int>,phmap::Hash<int>,phmap::EqualTo<int>,std::allocator<std::pair<int_const,int>>>
::find_ptr<int,phmap::LockableBaseImpl<std::mutex>::WriteLock>
          (parallel_hash_set<4ul,phmap::priv::raw_hash_set,std::mutex,phmap::priv::FlatHashMapPolicy<int,int>,phmap::Hash<int>,phmap::EqualTo<int>,std::allocator<std::pair<int_const,int>>>
           *this,key_arg<int> *key,size_t hashval,WriteLock *mutexlock)

{
  pthread_mutex_t *__mutex;
  bool bVar1;
  int iVar2;
  size_t in_RAX;
  pointer ppVar3;
  pthread_mutex_t *__mutex_00;
  size_t offset;
  size_t local_28;
  
  __mutex_00 = (pthread_mutex_t *)
               (this + (ulong)(((uint)(hashval >> 0x18) & 0xff ^
                               (uint)(hashval >> 0x10) & 0xffff ^ (uint)(hashval >> 8) & 0xffffff) &
                              0xf) * 0x58);
  local_28 = in_RAX;
  iVar2 = pthread_mutex_lock(__mutex_00);
  if (iVar2 == 0) {
    __mutex = (pthread_mutex_t *)mutexlock->m_;
    mutexlock->m_ = (mutex_type *)__mutex_00;
    bVar1 = mutexlock->locked_;
    mutexlock->locked_ = true;
    if (bVar1 == true) {
      pthread_mutex_unlock(__mutex);
    }
    bVar1 = raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_int>_>_>
            ::find_impl<int>((raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_int>_>_>
                              *)&__mutex_00[1].__data,key,hashval,&local_28);
    ppVar3 = (pointer)0x0;
    if (bVar1) {
      ppVar3 = (pointer)(local_28 * 8 + *(long *)((long)__mutex_00 + 0x30));
    }
    return ppVar3;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

pointer find_ptr(const key_arg<K>& key, size_t hashval, L& mutexlock)
    {
        Inner& inner = sets_[subidx(hashval)];
        auto& set = inner.set_;
        mutexlock = std::move(L(inner));
        return set.find_ptr(key, hashval);
    }